

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::setLayoutQualifier
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType,TString *id)

{
  int *piVar1;
  pointer pcVar2;
  size_type sVar3;
  TIntermediate *pTVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  EShLanguage EVar8;
  ulong uVar9;
  char *pcVar10;
  mapped_type *pmVar11;
  undefined **ppuVar12;
  char *pcVar13;
  TLayoutDepth d;
  TLayoutStencil s;
  long lVar14;
  _func_int *UNRECOVERED_JUMPTABLE;
  TLayoutFormat f;
  TInterlockOrdering order;
  TBlendEquationShift e;
  size_type sVar15;
  
  pcVar2 = (id->_M_dataplus)._M_p;
  sVar3 = id->_M_string_length;
  for (sVar15 = 0; sVar3 != sVar15; sVar15 = sVar15 + 1) {
    iVar7 = tolower((int)pcVar2[sVar15]);
    pcVar2[sVar15] = (char)iVar7;
  }
  bVar5 = std::operator==(id,"column_major");
  if (bVar5) {
    uVar9 = *(ulong *)&(publicType->qualifier).field_0x8 & 0x1fffffffffffffff | 0x4000000000000000;
LAB_003a8b27:
    *(ulong *)&(publicType->qualifier).field_0x8 = uVar9;
    return;
  }
  bVar5 = std::operator==(id,"row_major");
  if (bVar5) {
    uVar9 = (*(ulong *)&(publicType->qualifier).field_0x8 & 0x1fffffffffffffff) + 0x2000000000000000
    ;
    goto LAB_003a8b27;
  }
  bVar5 = std::operator==(id,"packed");
  if (bVar5) {
    if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) {
      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed != false) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x28])
                (this,loc,"packed");
    }
    bVar6 = (publicType->qualifier).field_0x10 & 0xf0 | 4;
LAB_003a8ca0:
    (publicType->qualifier).field_0x10 = bVar6;
    return;
  }
  bVar5 = std::operator==(id,"shared");
  if (bVar5) {
    if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) {
      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed != false) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x28])
                (this,loc,"shared");
    }
    bVar6 = ((publicType->qualifier).field_0x10 & 0xf0) + 1;
    goto LAB_003a8ca0;
  }
  bVar5 = std::operator==(id,"std140");
  if (bVar5) {
    bVar6 = (publicType->qualifier).field_0x10 & 0xf0 | 2;
    goto LAB_003a8ca0;
  }
  bVar5 = std::operator==(id,"std430");
  if (bVar5) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"std430");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x1ae,"GL_ARB_shader_storage_buffer_object","std430");
    TParseVersions::profileRequires((TParseVersions *)this,loc,8,0x136,(char *)0x0,"std430");
    bVar6 = (publicType->qualifier).field_0x10 & 0xf0 | 3;
    goto LAB_003a8ca0;
  }
  bVar5 = std::operator==(id,"scalar");
  if (bVar5) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"scalar");
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_scalar_block_layout,"scalar block layout");
    bVar6 = (publicType->qualifier).field_0x10 & 0xf0 | 5;
    goto LAB_003a8ca0;
  }
  for (f = ElfRgba32f; f != ElfCount; f = f + ElfRgba32f) {
    pcVar10 = TQualifier::getLayoutFormatString(f);
    bVar5 = std::operator==(id,pcVar10);
    if (bVar5) {
      if (((ElfEsUintGuard < f) || (f - ElfRg32f < 0xf)) || (f - ElfRg32i < 6)) {
        TParseVersions::requireProfile((TParseVersions *)this,loc,7,"image load-store format");
      }
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,7,0x1a4,"GL_ARB_shader_image_load_store",
                 "image load store");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x136,"GL_ARB_shader_image_load_store",
                 "image load store");
      (publicType->qualifier).field_0x2c = (char)f;
      return;
    }
  }
  bVar5 = std::operator==(id,"push_constant");
  if (bVar5) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"push_constant");
    (publicType->qualifier).layoutPushConstant = true;
    return;
  }
  bVar5 = std::operator==(id,"buffer_reference");
  if (bVar5) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"buffer_reference");
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_buffer_reference,"buffer_reference");
    (publicType->qualifier).layoutBufferReference = true;
    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar4->useStorageBuffer = true;
    pTVar4->usePhysicalStorageBuffer = true;
    return;
  }
  bVar5 = std::operator==(id,"bindless_sampler");
  if (bVar5) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_ARB_bindless_texture,"bindless_sampler");
    (publicType->qualifier).layoutBindlessSampler = true;
    lVar14 = 0x528;
LAB_003a8e59:
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
                            *)((long)&((this->super_TParseContextBase).super_TParseVersions.
                                      intermediate)->language + lVar14),&this->currentCaller);
    *pmVar11 = AstRefTypeLayout;
    return;
  }
  bVar5 = std::operator==(id,"bindless_image");
  if (bVar5) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_ARB_bindless_texture,"bindless_image");
    (publicType->qualifier).layoutBindlessImage = true;
    lVar14 = 0x558;
    goto LAB_003a8e59;
  }
  bVar5 = std::operator==(id,"bound_sampler");
  if (bVar5) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_ARB_bindless_texture,"bound_sampler");
    (publicType->qualifier).layoutBindlessSampler = false;
    return;
  }
  bVar5 = std::operator==(id,"bound_image");
  if (bVar5) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_ARB_bindless_texture,"bound_image");
    (publicType->qualifier).layoutBindlessImage = false;
    return;
  }
  EVar8 = (this->super_TParseContextBase).super_TParseVersions.language;
  if ((EVar8 < EShLangCount) && ((0x200cU >> (EVar8 & 0x1f) & 1) != 0)) {
    bVar5 = std::operator==(id,"triangles");
    if (bVar5) {
LAB_003a8f19:
      (publicType->shaderQualifiers).geometry = ElgTriangles;
      return;
    }
    EVar8 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EVar8 == EShLangTessEvaluation) {
      bVar5 = std::operator==(id,"triangles");
      if (bVar5) goto LAB_003a8f19;
      bVar5 = std::operator==(id,"quads");
      if (bVar5) {
        (publicType->shaderQualifiers).geometry = ElgQuads;
        return;
      }
      bVar5 = std::operator==(id,"isolines");
      if (bVar5) {
        (publicType->shaderQualifiers).geometry = ElgIsolines;
        return;
      }
      bVar5 = std::operator==(id,"equal_spacing");
      if (bVar5) {
        (publicType->shaderQualifiers).spacing = EvsEqual;
        return;
      }
      bVar5 = std::operator==(id,"fractional_even_spacing");
      if (bVar5) {
        (publicType->shaderQualifiers).spacing = EvsFractionalEven;
        return;
      }
      bVar5 = std::operator==(id,"fractional_odd_spacing");
      if (bVar5) {
        (publicType->shaderQualifiers).spacing = EvsFractionalOdd;
        return;
      }
      bVar5 = std::operator==(id,"cw");
      if (bVar5) {
        (publicType->shaderQualifiers).order = EvoCw;
        return;
      }
      bVar5 = std::operator==(id,"ccw");
      if (bVar5) {
        (publicType->shaderQualifiers).order = EvoCcw;
        return;
      }
      bVar5 = std::operator==(id,"point_mode");
      if (bVar5) {
        (publicType->shaderQualifiers).pointMode = true;
        return;
      }
    }
    else {
      if ((EVar8 != EShLangMesh) && (EVar8 != EShLangGeometry)) {
        __assert_fail("language == EShLangTessEvaluation",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                      ,0x17db,
                      "void glslang::TParseContext::setLayoutQualifier(const TSourceLoc &, TPublicType &, TString &)"
                     );
      }
      bVar5 = std::operator==(id,"points");
      if (bVar5) {
        (publicType->shaderQualifiers).geometry = ElgPoints;
        return;
      }
      bVar5 = std::operator==(id,"lines");
      if (bVar5) {
        (publicType->shaderQualifiers).geometry = ElgLines;
        return;
      }
      EVar8 = (this->super_TParseContextBase).super_TParseVersions.language;
      if (EVar8 != EShLangGeometry) goto LAB_003a9158;
      bVar5 = std::operator==(id,"line_strip");
      if (bVar5) {
        (publicType->shaderQualifiers).geometry = ElgLineStrip;
        return;
      }
      bVar5 = std::operator==(id,"lines_adjacency");
      if (bVar5) {
        (publicType->shaderQualifiers).geometry = ElgLinesAdjacency;
        return;
      }
      bVar5 = std::operator==(id,"triangles_adjacency");
      if (bVar5) {
        (publicType->shaderQualifiers).geometry = ElgTrianglesAdjacency;
        return;
      }
      bVar5 = std::operator==(id,"triangle_strip");
      if (bVar5) {
        (publicType->shaderQualifiers).geometry = ElgTriangleStrip;
        return;
      }
      bVar5 = std::operator==(id,"passthrough");
      if (bVar5) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,1,&E_SPV_NV_geometry_shader_passthrough,"geometry shader passthrough");
        (publicType->qualifier).layoutPassthrough = true;
        ((this->super_TParseContextBase).super_TParseVersions.intermediate)->geoPassthroughEXT =
             true;
        return;
      }
    }
    EVar8 = (this->super_TParseContextBase).super_TParseVersions.language;
  }
LAB_003a9158:
  if (EVar8 == EShLangFragment) {
    bVar5 = std::operator==(id,"origin_upper_left");
    if (bVar5) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,7,"origin_upper_left");
      if ((this->super_TParseContextBase).super_TParseVersions.profile == ENoProfile) {
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,6,0x8c,"GL_ARB_fragment_coord_conventions",
                   "origin_upper_left");
      }
      (publicType->shaderQualifiers).originUpperLeft = true;
      return;
    }
    bVar5 = std::operator==(id,"pixel_center_integer");
    if (bVar5) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,7,"pixel_center_integer");
      if ((this->super_TParseContextBase).super_TParseVersions.profile == ENoProfile) {
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,6,0x8c,"GL_ARB_fragment_coord_conventions",
                   "pixel_center_integer");
      }
      (publicType->shaderQualifiers).pixelCenterInteger = true;
      return;
    }
    bVar5 = std::operator==(id,"early_fragment_tests");
    if (bVar5) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,7,0x1a4,"GL_ARB_shader_image_load_store",
                 "early_fragment_tests");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x136,(char *)0x0,"early_fragment_tests");
      (publicType->shaderQualifiers).earlyFragmentTests = true;
      return;
    }
    bVar5 = std::operator==(id,"early_and_late_fragment_tests_amd");
    if (bVar5) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,7,0x1a4,"GL_AMD_shader_early_and_late_fragment_tests",
                 "early_and_late_fragment_tests_amd");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x136,(char *)0x0,"early_and_late_fragment_tests_amd")
      ;
      (publicType->shaderQualifiers).earlyAndLateFragmentTestsAMD = true;
      return;
    }
    bVar5 = std::operator==(id,"post_depth_coverage");
    if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,2,post_depth_coverageEXTs,"post depth coverage");
      iVar7 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_ARB_post_depth_coverage");
      if ((char)iVar7 != '\0') {
        (publicType->shaderQualifiers).earlyFragmentTests = true;
      }
      (publicType->shaderQualifiers).postDepthCoverage = true;
      return;
    }
    bVar5 = std::operator==(id,"non_coherent_color_attachment_readext");
    if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_shader_tile_image,"non_coherent_color_attachment_readEXT");
      (publicType->shaderQualifiers).nonCoherentColorAttachmentReadEXT = true;
      return;
    }
    bVar5 = std::operator==(id,"non_coherent_depth_attachment_readext");
    if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_shader_tile_image,"non_coherent_depth_attachment_readEXT");
      (publicType->shaderQualifiers).nonCoherentDepthAttachmentReadEXT = true;
      return;
    }
    bVar5 = std::operator==(id,"non_coherent_stencil_attachment_readext");
    if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_shader_tile_image,"non_coherent_stencil_attachment_readEXT");
      (publicType->shaderQualifiers).nonCoherentStencilAttachmentReadEXT = true;
      return;
    }
    for (d = EldAny; d != EldCount; d = d + EldAny) {
      pcVar10 = TQualifier::getLayoutDepthString(d);
      bVar5 = std::operator==(id,pcVar10);
      if (bVar5) {
        TParseVersions::requireProfile((TParseVersions *)this,loc,6,"depth layout qualifier");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,6,0x1a4,(char *)0x0,"depth layout qualifier");
        (publicType->shaderQualifiers).layoutDepth = d;
        return;
      }
    }
    for (s = ElsRefUnchangedFrontAMD; s != ElsCount; s = s + ElsRefUnchangedFrontAMD) {
      pcVar10 = TQualifier::getLayoutStencilString(s);
      bVar5 = std::operator==(id,pcVar10);
      if (bVar5) {
        TParseVersions::requireProfile((TParseVersions *)this,loc,6,"stencil layout qualifier");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,6,0x1a4,(char *)0x0,"stencil layout qualifier");
        (publicType->shaderQualifiers).layoutStencil = s;
        return;
      }
    }
    for (order = EioPixelInterlockOrdered; order != EioCount;
        order = order + EioPixelInterlockOrdered) {
      pcVar10 = TQualifier::getInterlockOrderingString(order);
      bVar5 = std::operator==(id,pcVar10);
      if (bVar5) {
        TParseVersions::requireProfile
                  ((TParseVersions *)this,loc,6,"fragment shader interlock layout qualifier");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,6,0x1c2,(char *)0x0,
                   "fragment shader interlock layout qualifier");
        pcVar10 = TQualifier::getInterlockOrderingString(order);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,1,&E_GL_ARB_fragment_shader_interlock,pcVar10);
        if (order - EioShadingRateInterlockOrdered < 2) {
          pcVar10 = TQualifier::getInterlockOrderingString(order);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                    (this,loc,1,&E_GL_NV_shading_rate_image,pcVar10);
        }
        (publicType->shaderQualifiers).interlockOrdering = order;
        return;
      }
    }
    e = EBlendMultiply;
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,0,0xd,"blend_support");
    if (iVar7 == 0) {
      for (; e != EBlendCount; e = e + EBlendScreen) {
        pcVar10 = TQualifier::getBlendEquationString(e);
        bVar5 = std::operator==(id,pcVar10);
        if (bVar5) {
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,8,0x140,"GL_KHR_blend_equation_advanced",
                     "blend equation");
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,-9,0,"GL_KHR_blend_equation_advanced",
                     "blend equation");
          piVar1 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                    blendEquations;
          *piVar1 = *piVar1 | 1 << ((byte)e & 0x1f);
          (publicType->shaderQualifiers).blendEquation = true;
          return;
        }
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar13 = "unknown blend equation";
      pcVar10 = "blend_support";
      goto LAB_003a98cb;
    }
    bVar5 = std::operator==(id,"override_coverage");
    if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_NV_sample_mask_override_coverage,"sample mask override coverage");
      (publicType->shaderQualifiers).layoutOverrideCoverage = true;
      return;
    }
    bVar5 = std::operator==(id,"full_quads");
    if (bVar5) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"full_quads qualifier");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x8c,"GL_EXT_shader_quad_control",
                 "full_quads qualifier");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x136,"GL_EXT_shader_quad_control",
                 "full_quads qualifier");
      (publicType->qualifier).layoutFullQuads = true;
      return;
    }
    EVar8 = (this->super_TParseContextBase).super_TParseVersions.language;
  }
  if (EVar8 - EShLangRayGen < 6) {
    bVar5 = std::operator==(id,"shaderrecordnv");
    if ((bVar5) || (bVar5 = std::operator==(id,"shaderrecordext"), bVar5)) {
      bVar5 = std::operator==(id,"shaderrecordnv");
      if (bVar5) {
        ppuVar12 = &E_GL_NV_ray_tracing;
        pcVar10 = "shader record NV";
      }
      else {
        ppuVar12 = &E_GL_EXT_ray_tracing;
        pcVar10 = "shader record EXT";
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,ppuVar12,pcVar10);
      (publicType->qualifier).layoutShaderRecord = true;
      return;
    }
    bVar5 = std::operator==(id,"hitobjectshaderrecordnv");
    if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_NV_shader_invocation_reorder,"hitobject shader record NV");
      (publicType->qualifier).layoutHitObjectShaderRecordNV = true;
      return;
    }
LAB_003a97e2:
    EVar8 = (this->super_TParseContextBase).super_TParseVersions.language;
  }
  else if (EVar8 < EShLangFragment) {
    bVar5 = std::operator==(id,"viewport_relative");
    if (bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_NV_viewport_array2,"view port array2");
      (publicType->qualifier).layoutViewportRelative = true;
      return;
    }
    goto LAB_003a97e2;
  }
  if ((EVar8 == EShLangCompute) &&
     (iVar7 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,0,0x11,"derivative_group_"), iVar7 == 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_NV_compute_shader_derivatives,"compute shader derivatives");
    bVar5 = std::operator==(id,"derivative_group_quadsnv");
    if (bVar5) {
      (publicType->shaderQualifiers).layoutDerivativeGroupQuads = true;
      return;
    }
    bVar5 = std::operator==(id,"derivative_group_linearnv");
    if (bVar5) {
      (publicType->shaderQualifiers).layoutDerivativeGroupLinear = true;
      return;
    }
  }
  bVar5 = std::operator==(id,"primitive_culling");
  if (bVar5) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_ray_flags_primitive_culling,"primitive culling");
    (publicType->shaderQualifiers).layoutPrimitiveCulling = true;
    return;
  }
  bVar5 = std::operator==(id,"quad_derivatives");
  if (bVar5) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"quad_derivatives qualifier");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x8c,"GL_EXT_shader_quad_control",
               "quad_derivatives qualifier");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,8,0x136,"GL_EXT_shader_quad_control",
               "quad_derivatives qualifier");
    (publicType->qualifier).layoutQuadDeriv = true;
    return;
  }
  pcVar10 = (id->_M_dataplus)._M_p;
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  pcVar13 = "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)";
LAB_003a98cb:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar13,pcVar10,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::setLayoutQualifier(const TSourceLoc& loc, TPublicType& publicType, TString& id)
{
    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == TQualifier::getLayoutMatrixString(ElmColumnMajor)) {
        publicType.qualifier.layoutMatrix = ElmColumnMajor;
        return;
    }
    if (id == TQualifier::getLayoutMatrixString(ElmRowMajor)) {
        publicType.qualifier.layoutMatrix = ElmRowMajor;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpPacked)) {
        if (spvVersion.spv != 0) {
            if (spvVersion.vulkanRelaxed)
                return; // silently ignore qualifier
            else
                spvRemoved(loc, "packed");
        }
        publicType.qualifier.layoutPacking = ElpPacked;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpShared)) {
        if (spvVersion.spv != 0) {
            if (spvVersion.vulkanRelaxed)
                return; // silently ignore qualifier
            else
                spvRemoved(loc, "shared");
        }
        publicType.qualifier.layoutPacking = ElpShared;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpStd140)) {
        publicType.qualifier.layoutPacking = ElpStd140;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpStd430)) {
        requireProfile(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, "std430");
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 430, E_GL_ARB_shader_storage_buffer_object, "std430");
        profileRequires(loc, EEsProfile, 310, nullptr, "std430");
        publicType.qualifier.layoutPacking = ElpStd430;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpScalar)) {
        requireVulkan(loc, "scalar");
        requireExtensions(loc, 1, &E_GL_EXT_scalar_block_layout, "scalar block layout");
        publicType.qualifier.layoutPacking = ElpScalar;
        return;
    }
    // TODO: compile-time performance: may need to stop doing linear searches
    for (TLayoutFormat format = (TLayoutFormat)(ElfNone + 1); format < ElfCount; format = (TLayoutFormat)(format + 1)) {
        if (id == TQualifier::getLayoutFormatString(format)) {
            if ((format > ElfEsFloatGuard && format < ElfFloatGuard) ||
                (format > ElfEsIntGuard && format < ElfIntGuard) ||
                (format > ElfEsUintGuard && format < ElfCount))
                requireProfile(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, "image load-store format");
            profileRequires(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, 420, E_GL_ARB_shader_image_load_store, "image load store");
            profileRequires(loc, EEsProfile, 310, E_GL_ARB_shader_image_load_store, "image load store");
            publicType.qualifier.layoutFormat = format;
            return;
        }
    }
    if (id == "push_constant") {
        requireVulkan(loc, "push_constant");
        publicType.qualifier.layoutPushConstant = true;
        return;
    }
    if (id == "buffer_reference") {
        requireVulkan(loc, "buffer_reference");
        requireExtensions(loc, 1, &E_GL_EXT_buffer_reference, "buffer_reference");
        publicType.qualifier.layoutBufferReference = true;
        intermediate.setUseStorageBuffer();
        intermediate.setUsePhysicalStorageBuffer();
        return;
    }
    if (id == "bindless_sampler") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bindless_sampler");
        publicType.qualifier.layoutBindlessSampler = true;
        intermediate.setBindlessTextureMode(currentCaller, AstRefTypeLayout);
        return;
    }
    if (id == "bindless_image") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bindless_image");
        publicType.qualifier.layoutBindlessImage = true;
        intermediate.setBindlessImageMode(currentCaller, AstRefTypeLayout);
        return;
    }
    if (id == "bound_sampler") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bound_sampler");
        publicType.qualifier.layoutBindlessSampler = false;
        return;
    }
    if (id == "bound_image") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bound_image");
        publicType.qualifier.layoutBindlessImage = false;
        return;
    }
    if (language == EShLangGeometry || language == EShLangTessEvaluation || language == EShLangMesh) {
        if (id == TQualifier::getGeometryString(ElgTriangles)) {
            publicType.shaderQualifiers.geometry = ElgTriangles;
            return;
        }
        if (language == EShLangGeometry || language == EShLangMesh) {
            if (id == TQualifier::getGeometryString(ElgPoints)) {
                publicType.shaderQualifiers.geometry = ElgPoints;
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLines)) {
                publicType.shaderQualifiers.geometry = ElgLines;
                return;
            }
            if (language == EShLangGeometry) {
                if (id == TQualifier::getGeometryString(ElgLineStrip)) {
                    publicType.shaderQualifiers.geometry = ElgLineStrip;
                    return;
                }
                if (id == TQualifier::getGeometryString(ElgLinesAdjacency)) {
                    publicType.shaderQualifiers.geometry = ElgLinesAdjacency;
                    return;
                }
                if (id == TQualifier::getGeometryString(ElgTrianglesAdjacency)) {
                    publicType.shaderQualifiers.geometry = ElgTrianglesAdjacency;
                    return;
                }
                if (id == TQualifier::getGeometryString(ElgTriangleStrip)) {
                    publicType.shaderQualifiers.geometry = ElgTriangleStrip;
                    return;
                }
                if (id == "passthrough") {
                    requireExtensions(loc, 1, &E_SPV_NV_geometry_shader_passthrough, "geometry shader passthrough");
                    publicType.qualifier.layoutPassthrough = true;
                    intermediate.setGeoPassthroughEXT();
                    return;
                }
            }
        } else {
            assert(language == EShLangTessEvaluation);

            // input primitive
            if (id == TQualifier::getGeometryString(ElgTriangles)) {
                publicType.shaderQualifiers.geometry = ElgTriangles;
                return;
            }
            if (id == TQualifier::getGeometryString(ElgQuads)) {
                publicType.shaderQualifiers.geometry = ElgQuads;
                return;
            }
            if (id == TQualifier::getGeometryString(ElgIsolines)) {
                publicType.shaderQualifiers.geometry = ElgIsolines;
                return;
            }

            // vertex spacing
            if (id == TQualifier::getVertexSpacingString(EvsEqual)) {
                publicType.shaderQualifiers.spacing = EvsEqual;
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalEven)) {
                publicType.shaderQualifiers.spacing = EvsFractionalEven;
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalOdd)) {
                publicType.shaderQualifiers.spacing = EvsFractionalOdd;
                return;
            }

            // triangle order
            if (id == TQualifier::getVertexOrderString(EvoCw)) {
                publicType.shaderQualifiers.order = EvoCw;
                return;
            }
            if (id == TQualifier::getVertexOrderString(EvoCcw)) {
                publicType.shaderQualifiers.order = EvoCcw;
                return;
            }

            // point mode
            if (id == "point_mode") {
                publicType.shaderQualifiers.pointMode = true;
                return;
            }
        }
    }
    if (language == EShLangFragment) {
        if (id == "origin_upper_left") {
            requireProfile(loc, ECoreProfile | ECompatibilityProfile | ENoProfile, "origin_upper_left");
            if (profile == ENoProfile) {
                profileRequires(loc,ECoreProfile | ECompatibilityProfile, 140, E_GL_ARB_fragment_coord_conventions, "origin_upper_left");
            }

            publicType.shaderQualifiers.originUpperLeft = true;
            return;
        }
        if (id == "pixel_center_integer") {
            requireProfile(loc, ECoreProfile | ECompatibilityProfile | ENoProfile, "pixel_center_integer");
            if (profile == ENoProfile) {
                profileRequires(loc,ECoreProfile | ECompatibilityProfile, 140, E_GL_ARB_fragment_coord_conventions, "pixel_center_integer");
            }
            publicType.shaderQualifiers.pixelCenterInteger = true;
            return;
        }
        if (id == "early_fragment_tests") {
            profileRequires(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, 420, E_GL_ARB_shader_image_load_store, "early_fragment_tests");
            profileRequires(loc, EEsProfile, 310, nullptr, "early_fragment_tests");
            publicType.shaderQualifiers.earlyFragmentTests = true;
            return;
        }
        if (id == "early_and_late_fragment_tests_amd") {
            profileRequires(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, 420, E_GL_AMD_shader_early_and_late_fragment_tests, "early_and_late_fragment_tests_amd");
            profileRequires(loc, EEsProfile, 310, nullptr, "early_and_late_fragment_tests_amd");
            publicType.shaderQualifiers.earlyAndLateFragmentTestsAMD = true;
            return;
        }
        if (id == "post_depth_coverage") {
            requireExtensions(loc, Num_post_depth_coverageEXTs, post_depth_coverageEXTs, "post depth coverage");
            if (extensionTurnedOn(E_GL_ARB_post_depth_coverage)) {
                publicType.shaderQualifiers.earlyFragmentTests = true;
            }
            publicType.shaderQualifiers.postDepthCoverage = true;
            return;
        }
        /* id is transformed into lower case in the beginning of this function. */
        if (id == "non_coherent_color_attachment_readext") {
            requireExtensions(loc, 1, &E_GL_EXT_shader_tile_image, "non_coherent_color_attachment_readEXT");
            publicType.shaderQualifiers.nonCoherentColorAttachmentReadEXT = true;
            return;
        }
        if (id == "non_coherent_depth_attachment_readext") {
            requireExtensions(loc, 1, &E_GL_EXT_shader_tile_image, "non_coherent_depth_attachment_readEXT");
            publicType.shaderQualifiers.nonCoherentDepthAttachmentReadEXT = true;
            return;
        }
        if (id == "non_coherent_stencil_attachment_readext") {
            requireExtensions(loc, 1, &E_GL_EXT_shader_tile_image, "non_coherent_stencil_attachment_readEXT");
            publicType.shaderQualifiers.nonCoherentStencilAttachmentReadEXT = true;
            return;
        }
        for (TLayoutDepth depth = (TLayoutDepth)(EldNone + 1); depth < EldCount; depth = (TLayoutDepth)(depth+1)) {
            if (id == TQualifier::getLayoutDepthString(depth)) {
                requireProfile(loc, ECoreProfile | ECompatibilityProfile, "depth layout qualifier");
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 420, nullptr, "depth layout qualifier");
                publicType.shaderQualifiers.layoutDepth = depth;
                return;
            }
        }
        for (TLayoutStencil stencil = (TLayoutStencil)(ElsNone + 1); stencil < ElsCount; stencil = (TLayoutStencil)(stencil+1)) {
            if (id == TQualifier::getLayoutStencilString(stencil)) {
                requireProfile(loc, ECoreProfile | ECompatibilityProfile, "stencil layout qualifier");
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 420, nullptr, "stencil layout qualifier");
                publicType.shaderQualifiers.layoutStencil = stencil;
                return;
            }
        }
        for (TInterlockOrdering order = (TInterlockOrdering)(EioNone + 1); order < EioCount; order = (TInterlockOrdering)(order+1)) {
            if (id == TQualifier::getInterlockOrderingString(order)) {
                requireProfile(loc, ECoreProfile | ECompatibilityProfile, "fragment shader interlock layout qualifier");
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 450, nullptr, "fragment shader interlock layout qualifier");
                requireExtensions(loc, 1, &E_GL_ARB_fragment_shader_interlock, TQualifier::getInterlockOrderingString(order));
                if (order == EioShadingRateInterlockOrdered || order == EioShadingRateInterlockUnordered)
                    requireExtensions(loc, 1, &E_GL_NV_shading_rate_image, TQualifier::getInterlockOrderingString(order));
                publicType.shaderQualifiers.interlockOrdering = order;
                return;
            }
        }
        if (id.compare(0, 13, "blend_support") == 0) {
            bool found = false;
            for (TBlendEquationShift be = (TBlendEquationShift)0; be < EBlendCount; be = (TBlendEquationShift)(be + 1)) {
                if (id == TQualifier::getBlendEquationString(be)) {
                    profileRequires(loc, EEsProfile, 320, E_GL_KHR_blend_equation_advanced, "blend equation");
                    profileRequires(loc, ~EEsProfile, 0, E_GL_KHR_blend_equation_advanced, "blend equation");
                    intermediate.addBlendEquation(be);
                    publicType.shaderQualifiers.blendEquation = true;
                    found = true;
                    break;
                }
            }
            if (! found)
                error(loc, "unknown blend equation", "blend_support", "");
            return;
        }
        if (id == "override_coverage") {
            requireExtensions(loc, 1, &E_GL_NV_sample_mask_override_coverage, "sample mask override coverage");
            publicType.shaderQualifiers.layoutOverrideCoverage = true;
            return;
        }
        if (id == "full_quads")
        {
            const char* feature = "full_quads qualifier";
            requireProfile(loc, ECompatibilityProfile | ECoreProfile | EEsProfile, feature);
            profileRequires(loc, ECoreProfile | ECompatibilityProfile, 140, E_GL_EXT_shader_quad_control, feature);
            profileRequires(loc, EEsProfile, 310, E_GL_EXT_shader_quad_control, feature);
            publicType.qualifier.layoutFullQuads = true;
            return;
        }
    }
    if (language == EShLangVertex ||
        language == EShLangTessControl ||
        language == EShLangTessEvaluation ||
        language == EShLangGeometry ) {
        if (id == "viewport_relative") {
            requireExtensions(loc, 1, &E_GL_NV_viewport_array2, "view port array2");
            publicType.qualifier.layoutViewportRelative = true;
            return;
        }
    } else {
        if (language == EShLangRayGen || language == EShLangIntersect ||
        language == EShLangAnyHit || language == EShLangClosestHit ||
        language == EShLangMiss || language == EShLangCallable) {
            if (id == "shaderrecordnv" || id == "shaderrecordext") {
                if (id == "shaderrecordnv") {
                    requireExtensions(loc, 1, &E_GL_NV_ray_tracing, "shader record NV");
                } else {
                    requireExtensions(loc, 1, &E_GL_EXT_ray_tracing, "shader record EXT");
                }
                publicType.qualifier.layoutShaderRecord = true;
                return;
            } else if (id == "hitobjectshaderrecordnv") {
                requireExtensions(loc, 1, &E_GL_NV_shader_invocation_reorder, "hitobject shader record NV");
                publicType.qualifier.layoutHitObjectShaderRecordNV = true;
                return;
            }

        }
    }
    if (language == EShLangCompute) {
        if (id.compare(0, 17, "derivative_group_") == 0) {
            requireExtensions(loc, 1, &E_GL_NV_compute_shader_derivatives, "compute shader derivatives");
            if (id == "derivative_group_quadsnv") {
                publicType.shaderQualifiers.layoutDerivativeGroupQuads = true;
                return;
            } else if (id == "derivative_group_linearnv") {
                publicType.shaderQualifiers.layoutDerivativeGroupLinear = true;
                return;
            }
        }
    }

    if (id == "primitive_culling") {
        requireExtensions(loc, 1, &E_GL_EXT_ray_flags_primitive_culling, "primitive culling");
        publicType.shaderQualifiers.layoutPrimitiveCulling = true;
        return;
    }

    if (id == "quad_derivatives")
    {
        const char* feature = "quad_derivatives qualifier";
        requireProfile(loc, ECompatibilityProfile | ECoreProfile | EEsProfile, feature);
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 140, E_GL_EXT_shader_quad_control, feature);
        profileRequires(loc, EEsProfile, 310, E_GL_EXT_shader_quad_control, feature);
        publicType.qualifier.layoutQuadDeriv = true;
        return;
    }

    error(loc, "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)", id.c_str(), "");
}